

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O1

void calc_light(player *p,player_state_conflict *state,_Bool update)

{
  uint32_t *puVar1;
  bitflag *pbVar2;
  _Bool _Var3;
  object *obj;
  int iVar4;
  wchar_t slot;
  
  state->cur_light = L'\0';
  if ((p->depth == 0) && (_Var3 = is_daytime(), _Var3 && update)) {
    if ((p->state).cur_light == state->cur_light) {
      return;
    }
    puVar1 = &p->upkeep->update;
    *puVar1 = *puVar1 | 0xc0;
    return;
  }
  if ((p->body).count != 0) {
    slot = L'\0';
    do {
      obj = slot_object(p,slot);
      if (obj != (object *)0x0) {
        pbVar2 = obj->flags;
        _Var3 = flag_has_dbg(pbVar2,6,0x22,"obj->flags","OF_LIGHT_2");
        iVar4 = 2;
        if (!_Var3) {
          _Var3 = flag_has_dbg(pbVar2,6,0x23,"obj->flags","OF_LIGHT_3");
          iVar4 = (uint)_Var3 + (uint)_Var3 * 2;
        }
        iVar4 = iVar4 + obj->modifiers[0xd];
        if (0 < obj->modifiers[0xd]) {
          _Var3 = flag_has_dbg(state->pflags,10,0x1f,"state->pflags","PF_UNLIGHT");
          iVar4 = iVar4 - (uint)_Var3;
        }
        _Var3 = tval_is_light(obj);
        if (((_Var3) && (_Var3 = flag_has_dbg(pbVar2,6,0x19,"obj->flags","OF_NO_FUEL"), !_Var3)) &&
           (obj->timeout == 0)) {
          iVar4 = 0;
        }
        state->cur_light = state->cur_light + iVar4;
      }
      slot = slot + L'\x01';
    } while ((uint)slot < (uint)(p->body).count);
  }
  pbVar2 = state->pflags;
  _Var3 = flag_has_dbg(pbVar2,10,0x2e,"state->pflags","PF_HOLY");
  if ((_Var3) &&
     (((0x23 < p->lev &&
       (_Var3 = flag_has_dbg(pbVar2,10,0x2d,"state->pflags","PF_STRONG_MAGIC"), _Var3)) ||
      (0x2d < p->lev)))) {
    state->cur_light = state->cur_light + L'\x01';
  }
  _Var3 = flag_has_dbg(pbVar2,10,0x4e,"state->pflags","PF_HOLY_LIGHT");
  if (_Var3) {
    state->cur_light = state->cur_light + L'\x01';
  }
  return;
}

Assistant:

static void calc_light(struct player *p, struct player_state *state,
					   bool update)
{
	int i;

	/* Assume no light */
	state->cur_light = 0;

	/* Ascertain lightness if in the town */
	if (!p->depth && is_daytime() && update) {
		/* Update the visuals if necessary*/
		if (p->state.cur_light != state->cur_light)
			p->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

		return;
	}

	/* Examine all wielded objects, use the brightest */
	for (i = 0; i < p->body.count; i++) {
		int amt = 0;
		struct object *obj = slot_object(p, i);

		/* Skip empty slots */
		if (!obj) continue;

		/* Light radius - innate plus modifier */
		if (of_has(obj->flags, OF_LIGHT_2)) {
			amt = 2;
		} else if (of_has(obj->flags, OF_LIGHT_3)) {
			amt = 3;
		}
		amt += obj->modifiers[OBJ_MOD_LIGHT];

		/* Adjustment to allow UNLIGHT players to use +1 LIGHT gear */
		if ((obj->modifiers[OBJ_MOD_LIGHT] > 0) && pf_has(state->pflags, PF_UNLIGHT)) {
			amt--;
		}

		/* Examine actual lights */
		if (tval_is_light(obj) && !of_has(obj->flags, OF_NO_FUEL) &&
				obj->timeout == 0)
			/* Lights without fuel provide no light */
			amt = 0;

		/* Alter p->state.cur_light if reasonable */
	    state->cur_light += amt;
	}

	/* Class ability Holy */
	if (pf_has(state->pflags, PF_HOLY)) {
		if ((p->lev > 35) && pf_has(state->pflags, PF_STRONG_MAGIC)) {
			state->cur_light++;
		} else if (p->lev > 45) {
			state->cur_light++;
		}
	}

	/* Special ability Holy Light */
	if (pf_has(state->pflags, PF_HOLY_LIGHT)) {
		state->cur_light++;
	}
}